

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

bool __thiscall GraphPropagator::propagate(GraphPropagator *this)

{
  uint uVar1;
  BoolView *pBVar2;
  bool bVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  
  uVar1 = (this->vs).sz;
  bVar5 = 0 < (int)uVar1;
  if (0 < (int)uVar1) {
    lVar7 = 0xc;
    lVar6 = 0;
    do {
      pBVar2 = (this->vs).data;
      if (((sat.assigns.data[*(uint *)((long)pBVar2 + lVar7 + -4)] != '\0') &&
          ((uint)*(byte *)((long)&(pBVar2->super_Var).super_Branching._vptr_Branching + lVar7) * 2 +
           -1 == (int)sat.assigns.data[*(uint *)((long)pBVar2 + lVar7 + -4)])) &&
         (bVar3 = coherence_outedges(this,(int)lVar6), !bVar3)) {
        if (bVar5) {
          return false;
        }
        break;
      }
      lVar6 = lVar6 + 1;
      lVar4 = (long)(int)(this->vs).sz;
      lVar7 = lVar7 + 0x10;
      bVar5 = lVar6 < lVar4;
    } while (lVar6 < lVar4);
  }
  uVar1 = (this->es).sz;
  bVar5 = (int)uVar1 < 1;
  if (0 < (int)uVar1) {
    lVar7 = 0xc;
    lVar6 = 0;
    do {
      pBVar2 = (this->es).data;
      if (((sat.assigns.data[*(uint *)((long)pBVar2 + lVar7 + -4)] != '\0') &&
          ((uint)*(byte *)((long)&(pBVar2->super_Var).super_Branching._vptr_Branching + lVar7) * -2
           + 1 == (int)sat.assigns.data[*(uint *)((long)pBVar2 + lVar7 + -4)])) &&
         (bVar3 = coherence_innodes(this,(int)lVar6), !bVar3)) {
        return bVar5;
      }
      lVar6 = lVar6 + 1;
      lVar4 = (long)(int)(this->es).sz;
      lVar7 = lVar7 + 0x10;
      bVar5 = lVar4 <= lVar6;
    } while (lVar6 < lVar4);
  }
  return bVar5;
}

Assistant:

bool GraphPropagator::propagate() {
	for (int i = 0; i < nbNodes(); i++) {
		if (getNodeVar(i).isFixed() && getNodeVar(i).isFalse()) {
			if (!coherence_outedges(i)) {
				return false;
			}
		}
	}
	for (int i = 0; i < nbEdges(); i++) {
		if (getEdgeVar(i).isFixed() && getEdgeVar(i).isTrue()) {
			if (!coherence_innodes(i)) {
				return false;
			}
		}
	}
	return true;
}